

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

Material * __thiscall btSoftBody::appendMaterial(btSoftBody *this)

{
  Material *pMVar1;
  int iVar2;
  btScalar bVar3;
  btScalar bVar4;
  Material *pm;
  
  pm = (Material *)btAlignedAllocInternal(0x18,0x10);
  pm->m_kVST = 0.0;
  pm->m_flags = 0;
  (pm->super_Element).m_tag = (void *)0x0;
  pm->m_kLST = 0.0;
  pm->m_kAST = 0.0;
  if ((this->m_materials).m_size < 1) {
    (pm->super_Element).m_tag = (void *)0x0;
    pm->m_kLST = 0.0;
    pm->m_kAST = 0.0;
    pm->m_kVST = 0.0;
    pm->m_flags = 0;
  }
  else {
    pMVar1 = *(this->m_materials).m_data;
    iVar2 = pMVar1->m_flags;
    pm->m_kVST = pMVar1->m_kVST;
    pm->m_flags = iVar2;
    bVar3 = pMVar1->m_kLST;
    bVar4 = pMVar1->m_kAST;
    (pm->super_Element).m_tag = (pMVar1->super_Element).m_tag;
    pm->m_kLST = bVar3;
    pm->m_kAST = bVar4;
  }
  btAlignedObjectArray<btSoftBody::Material_*>::push_back(&this->m_materials,&pm);
  return pm;
}

Assistant:

btSoftBody::Material*		btSoftBody::appendMaterial()
{
	Material*	pm=new(btAlignedAlloc(sizeof(Material),16)) Material();
	if(m_materials.size()>0)
		*pm=*m_materials[0];
	else
		ZeroInitialize(*pm);
	m_materials.push_back(pm);
	return(pm);
}